

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

int glfwInit(void)

{
  int iVar1;
  
  iVar1 = 1;
  if (_glfwInitialized == '\0') {
    memset(&_glfw,0,0x950);
    iVar1 = _glfwPlatformInit();
    if (iVar1 != 0) {
      _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
      if (_glfw.monitors != (_GLFWmonitor **)0x0) {
        _glfwInitialized = '\x01';
        glfwDefaultWindowHints();
        return 1;
      }
      _glfwInputError(0x10008,"No monitors found");
    }
    iVar1 = 0;
    _glfwPlatformTerminate();
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfwInitialized)
        return GL_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));

    if (!_glfwPlatformInit())
    {
        _glfwPlatformTerminate();
        return GL_FALSE;
    }

    _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
    if (_glfw.monitors == NULL)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR, "No monitors found");
        _glfwPlatformTerminate();
        return GL_FALSE;
    }

    _glfwInitialized = GL_TRUE;

    // Not all window hints have zero as their default value
    glfwDefaultWindowHints();

    return GL_TRUE;
}